

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int lhash_kv_init(unqlite_kv_engine *pEngine,int iPageSize)

{
  SyMemBackend *pBackend;
  int iVar1;
  unqlite_kv_io *puVar2;
  unqlite_kv_io *puVar3;
  uint uVar4;
  unqlite_kv_io *puVar5;
  
  pBackend = (SyMemBackend *)(pEngine + 1);
  SyMemBackendInitFromParent(pBackend,&sUnqlMPGlobal.sAllocator);
  *(int *)&pEngine[0x22].pIo = iPageSize;
  pEngine[0x18].pIo = (unqlite_kv_io *)lhash_bin_hash;
  pEngine[0x19].pIo = (unqlite_kv_io *)SyMemcmp;
  *(undefined4 *)((long)&pEngine[0x1c].pIo + 4) = 0x20;
  puVar2 = (unqlite_kv_io *)SyMemBackendAlloc(pBackend,0x100);
  pEngine[0x1b].pIo = puVar2;
  if (puVar2 == (unqlite_kv_io *)0x0) {
    SyMemBackendRelease(pBackend);
    iVar1 = -1;
  }
  else {
    uVar4 = *(int *)((long)&pEngine[0x1c].pIo + 4) << 3;
    if (uVar4 != 0) {
      puVar5 = (unqlite_kv_io *)((long)&puVar2->pHandle + (ulong)uVar4);
      do {
        *(undefined1 *)&puVar2->pHandle = 0;
        puVar3 = (unqlite_kv_io *)((long)&puVar2->pHandle + 1);
        if (puVar5 <= puVar3) break;
        *(undefined1 *)&puVar3->pHandle = 0;
        puVar3 = (unqlite_kv_io *)((long)&puVar2->pHandle + 2);
        if (puVar5 <= puVar3) break;
        *(undefined1 *)&puVar3->pHandle = 0;
        puVar3 = (unqlite_kv_io *)((long)&puVar2->pHandle + 3);
        if (puVar5 <= puVar3) break;
        *(undefined1 *)&puVar3->pHandle = 0;
        puVar2 = (unqlite_kv_io *)((long)&puVar2->pHandle + 4);
      } while (puVar2 < puVar5);
    }
    pEngine[0x24].pIo = (unqlite_kv_io *)0x0;
    pEngine[0x25].pIo = (unqlite_kv_io *)0x1;
    pEngine[0x26].pIo = (unqlite_kv_io *)0x2;
    *(undefined4 *)&pEngine[0x27].pIo = 0xfa782dcb;
    (*pEngine->pIo->xSetUnpin)(pEngine->pIo->pHandle,lhash_page_release);
    (*pEngine->pIo->xSetReload)(pEngine->pIo->pHandle,lhash_page_release);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int lhash_kv_init(unqlite_kv_engine *pEngine,int iPageSize)
{
	lhash_kv_engine *pHash = (lhash_kv_engine *)pEngine;
	int rc;

	/* This structure is always zeroed, go to the initialization directly */
	SyMemBackendInitFromParent(&pHash->sAllocator,unqliteExportMemBackend());
	pHash->iPageSize = iPageSize;
	/* Default hash function */
	pHash->xHash = lhash_bin_hash;
	/* Default comparison function */
	pHash->xCmp = SyMemcmp;
	/* Allocate a new record map */
	pHash->nBuckSize = 32;
	pHash->apMap = (lhash_bmap_rec **)SyMemBackendAlloc(&pHash->sAllocator,pHash->nBuckSize *sizeof(lhash_bmap_rec *));
	if( pHash->apMap == 0 ){
		rc = UNQLITE_NOMEM;
		goto err;
	}
	/* Zero the table */
	SyZero(pHash->apMap,pHash->nBuckSize * sizeof(lhash_bmap_rec *));
	/* Linear hashing components */
	pHash->split_bucket = 0; /* Logical not real bucket number */
	pHash->max_split_bucket = 1;
	pHash->nmax_split_nucket = 2;
	pHash->nMagic = L_HASH_MAGIC;
	/* Install the cache unpin and reload callbacks */
	pHash->pIo->xSetUnpin(pHash->pIo->pHandle,lhash_page_release);
	pHash->pIo->xSetReload(pHash->pIo->pHandle,lhash_page_release);
	return UNQLITE_OK;
err:
	SyMemBackendRelease(&pHash->sAllocator);
	return rc;
}